

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::splitsegment
          (tetgenmesh *this,face *splitseg,point encpt,double rrp,point encpt1,point encpt2,
          int qflag,int chkencflag)

{
  uint *puVar1;
  double dVar2;
  memorypool *pmVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  undefined4 *puVar9;
  shellface ppdVar10;
  shellface *pppdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  tetgenbehavior *ptVar15;
  ulong uVar16;
  face searchsh;
  point newpt;
  face local_140;
  point local_130;
  insertvertexflags local_128;
  triface local_b8;
  flipconstraints local_a8;
  
  if ((qflag == 0) && ((*(byte *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4) & 8) != 0))
  {
    return 0;
  }
  if (this->b->nobisect != 0) {
    if (this->checkconstraints == 0) {
      return 0;
    }
    lVar7 = (long)this->areaboundindex;
    ppdVar10 = splitseg->sh[lVar7];
    if (((double)ppdVar10 == 0.0) && (!NAN((double)ppdVar10))) {
      ppdVar10 = splitseg->sh[splitseg->shver >> 1];
      uVar13 = (ulong)ppdVar10 & 0xfffffffffffffff8;
      uVar14 = uVar13;
      if (uVar13 == 0) {
        return 0;
      }
      do {
        dVar2 = *(double *)(uVar14 + lVar7 * 8);
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          return 0;
        }
        ppdVar10 = *(shellface *)(uVar14 + (ulong)((uint)ppdVar10 & 6) * 4);
        uVar14 = (ulong)ppdVar10 & 0xfffffffffffffff8;
      } while ((uVar14 != uVar13) && (uVar14 != 0));
      if (uVar14 == 0) {
        return 0;
      }
      dVar2 = *(double *)(uVar14 + lVar7 * 8);
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return 0;
      }
    }
  }
  local_140.sh = (shellface *)0x0;
  local_140.shver = 0;
  local_128.refinetet.ver = 0;
  local_128.refinesh.shver = 0;
  local_128.refinetet.tet = (tetrahedron *)0x0;
  local_128.refinesh.sh = (shellface *)0x0;
  local_128.smlen = 0.0;
  local_128.cdtflag = 0;
  local_128.assignmeshsize = 0;
  local_128.sloc = 0;
  local_128.sbowywat = 0;
  local_128.refineflag = 0;
  makepoint(this,&local_130,FREESEGVERTEX);
  getsteinerptonsegment(this,splitseg,encpt,local_130);
  if (qflag == 0) {
    ptVar15 = this->b;
    pppdVar11 = splitseg->sh;
    if (ptVar15->cdtrefine == 0) {
      ppdVar10 = pppdVar11[splitseg->shver >> 1];
      uVar13 = (ulong)ppdVar10 & 0xfffffffffffffff8;
      uVar14 = uVar13;
      if (uVar13 != 0) {
        do {
          uVar16 = (ulong)((uint)ppdVar10 & 7);
          bVar5 = true;
          do {
            bVar4 = bVar5;
            uVar8 = uVar16;
            if (!bVar4) {
              uVar8 = (ulong)snextpivot[uVar16];
            }
            uVar8 = *(ulong *)(uVar14 + 0x30 + (long)(snextpivot[uVar8] >> 1) * 8);
            if ((uVar8 != 0) &&
               (uVar12 = (ulong)(((uint)uVar8 & 7) << 2),
               iVar6 = checkseg4encroach(this,*(point *)((uVar8 & 0xfffffffffffffff8) +
                                                        (long)*(int *)((long)sorgpivot + uVar12) * 8
                                                        ),
                                         *(point *)((uVar8 & 0xfffffffffffffff8) +
                                                   (long)*(int *)((long)sdestpivot + uVar12) * 8),
                                         local_130), iVar6 != 0)) {
              *(uint *)((long)local_130 + (long)this->pointmarkindex * 4 + 4) =
                   *(byte *)((long)local_130 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
              pmVar3 = this->points;
              *local_130 = (double)pmVar3->deaditemstack;
              pmVar3->deaditemstack = local_130;
              pmVar3->items = pmVar3->items + -1;
              goto LAB_00149235;
            }
            bVar5 = false;
          } while (bVar4);
          ppdVar10 = *(shellface *)(uVar14 + (ulong)((uint)ppdVar10 & 6) * 4);
          uVar14 = (ulong)ppdVar10 & 0xfffffffffffffff8;
        } while ((uVar14 != 0) && (uVar14 != uVar13));
      }
    }
  }
  else {
    pppdVar11 = splitseg->sh;
    ptVar15 = this->b;
  }
  local_b8.ver = (uint)pppdVar11[9] & 0xf;
  local_b8.tet = (tetrahedron *)((ulong)pppdVar11[9] & 0xfffffffffffffff0);
  local_128.validflag = 1;
  local_128.rejflag = (uint)(ptVar15->metric != 0) << 2;
  local_128.chkencflag = chkencflag;
  local_128.sloc = 0xb;
  local_128.sbowywat = 3;
  local_128.iloc = 4;
  local_128.bowywat = 3;
  local_128.lawson = 2;
  local_128.splitbdflag = 1;
  local_128.respectbdflag = 1;
  local_128.assignmeshsize = ptVar15->metric;
  local_128.smlenflag = this->useinsertradius;
  iVar6 = insertpoint(this,local_130,&local_b8,&local_140,splitseg,&local_128);
  if (iVar6 == 0) {
    if (local_128.iloc == 9) {
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 2;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
    *(uint *)((long)local_130 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)local_130 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar3 = this->points;
    *local_130 = (double)pmVar3->deaditemstack;
    pmVar3->deaditemstack = local_130;
    pmVar3->items = pmVar3->items + -1;
    puVar1 = (uint *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4);
    *puVar1 = *puVar1 | 8;
LAB_00149235:
    iVar6 = 0;
  }
  else {
    this->st_segref_count = this->st_segref_count + 1;
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
    if (this->useinsertradius != 0) {
      save_segmentpoint_insradius(this,local_130,local_128.parentpt,local_128.smlen);
    }
    iVar6 = 1;
    if (this->flipstack != (badface *)0x0) {
      local_a8.seg[0] = (point)0x0;
      local_a8.fac[0] = (point)0x0;
      local_a8.remvert = (point)0x0;
      local_a8.unflip = 0;
      local_a8.collectnewtets = 0;
      local_a8.collectencsegflag = 0;
      local_a8.remove_ndelaunay_edge = 0;
      local_a8.bak_tetprism_vol = 0.0;
      local_a8.tetprism_vol_sum = 0.0;
      local_a8.remove_large_angle = 0;
      local_a8.cosdihed_in = 0.0;
      local_a8.cosdihed_out = 0.0;
      local_a8.checkflipeligibility = 0;
      local_a8.chkencflag = chkencflag;
      local_a8.enqflag = 2;
      lawsonflip3d(this,&local_a8);
      this->unflipqueue->objects = 0;
    }
  }
  return iVar6;
}

Assistant:

int tetgenmesh::splitsegment(face *splitseg, point encpt, REAL rrp, 
                             point encpt1, point encpt2, int qflag, 
                             int chkencflag)
{

  if (!qflag && smarktest3ed(*splitseg)) {
    // Do not try to re-split a marked segment.
    return 0;
  }

  if (b->nobisect) { // With -Y option.
    // Only split this segment if it is allowed to be split.
    if (checkconstraints) {
      // Check if it has a non-zero length bound. 
      if (areabound(*splitseg) == 0) {
        // It is not allowed.  However, if all of facets containing this seg
        //   is allowed to be split, we still split it.
        face parentsh, spinsh;
        //splitseg.shver = 0;
        spivot(*splitseg, parentsh);
        if (parentsh.sh == NULL) {
          return 0; // A dangling segment. Do not split it.
        }
        spinsh = parentsh;
        while (1) {
          if (areabound(spinsh) == 0) break;
          spivotself(spinsh);
          if (spinsh.sh == parentsh.sh) break;
		  if (spinsh.sh == NULL) break;  // It belongs to only one facet.
        }
        if ((!spinsh.sh) || (areabound(spinsh) == 0)) {
          // All facets at this seg are not allowed to be split.
          return 0;  // Do not split it.
        }
      }
    } else {
      return 0; // Do not split this segment.
    }
  } // if (b->nobisect)

  triface searchtet;
  face searchsh;
  point newpt;
  insertvertexflags ivf;

  makepoint(&newpt, FREESEGVERTEX);
  getsteinerptonsegment(splitseg, encpt, newpt);

  if (!qflag && !b->cdtrefine) {
    // Do not insert the point if it encroaches upon an adjacent segment.
    face parentsh;
    spivot(*splitseg, parentsh);
    if (parentsh.sh != NULL) {
      face spinsh, neighsh;
      face neighseg;
      spinsh = parentsh;
      while (1) {
        for (int i = 0; i < 2; i++) {
          if (i == 0) {
            senext(spinsh, neighsh);
          } else {
            senext2(spinsh, neighsh);
          }
          if (isshsubseg(neighsh)) {
            sspivot(neighsh, neighseg);
            if (checkseg4encroach(sorg(neighseg), sdest(neighseg), newpt)) {
              pointdealloc(newpt);
              return 0; // Do not split this segment.
            }
          }
        } // i
        spivotself(spinsh);
        if (spinsh.sh == NULL) break;
        if (spinsh.sh == parentsh.sh) break;
      } // while (1)
    }
  }

  // Split the segment by the Bowyer-Watson algorithm.
  sstpivot1(*splitseg, searchtet);
  ivf.iloc = (int) ONEDGE;
  ivf.bowywat = 3; // Use Bowyer-Watson, preserve subsegments and subfaces;
  ivf.validflag = 1; // Validate the B-W cavity.
  ivf.lawson = 2; // Do flips to recover Delaunayness.
  ivf.rejflag = 0;     // Do not check encroachment of new segments/facets.
  if (b->metric) {
    ivf.rejflag |= 4;  // Do check encroachment of protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = (int) INSTAR; // ivf.iloc;
  ivf.sbowywat = 3; // ivf.bowywat;  // Surface mesh options.
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.


  if (insertpoint(newpt, &searchtet, &searchsh, splitseg, &ivf)) {
    st_segref_count++;
    if (steinerleft > 0) steinerleft--;
    if (useinsertradius) {
      save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
    }
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    if (ivf.iloc == (int) NEARVERTEX) {
      terminatetetgen(this, 2);
    }
    pointdealloc(newpt);
    // Mark this segment to avoid splitting in the future.
	smarktest3(*splitseg);
    return 0;
  }
}